

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1ef7149::ConvolveScaleTestBase<unsigned_char>::~ConvolveScaleTestBase
          (ConvolveScaleTestBase<unsigned_char> *this)

{
  TestImage<unsigned_char> *this_00;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ConvolveScaleTestBase_00f6fd68;
  this_00 = this->image_;
  if (this_00 != (TestImage<unsigned_char> *)0x0) {
    TestImage<unsigned_char>::~TestImage(this_00);
  }
  operator_delete(this_00);
  libaom_test::CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
  ::~CodecTestWith3Params
            ((CodecTestWith3Params<libaom_test::TestMode,(anonymous_namespace)::TestVideoParam,int>
              *)this);
  return;
}

Assistant:

~ConvolveScaleTestBase() override { delete image_; }